

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *piVar2;
  iterator *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  iterator *piVar6;
  iterator *piVar7;
  iterator iVar8;
  
  piVar1 = (iterator *)a->ctrl_;
  if ((piVar1 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       piVar1 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar1->ctrl_)) {
    piVar2 = (iterator *)b->ctrl_;
    if ((piVar2 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
         piVar2 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar2->ctrl_)) {
      if (piVar1 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
          piVar2 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_0016c6fd:
        return piVar1 == piVar2;
      }
      if ((piVar1 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_) !=
          (piVar2 == (iterator *)google::protobuf::internal::TypeCardToString_abi_cxx11_))
      goto LAB_0016c719;
      if (piVar1 == (iterator *)0x0 || piVar2 == (iterator *)0x0) goto LAB_0016c6fd;
      if ((piVar2 == (iterator *)&kSooControl) == (piVar1 == (iterator *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        piVar3 = (iterator *)(b->field_1).slot_;
        if (piVar1 == (iterator *)&kSooControl) {
          if (a == piVar3) goto LAB_0016c6fd;
        }
        else {
          piVar7 = piVar3;
          piVar6 = piVar2;
          b = a;
          if (piVar2 < piVar1) {
            piVar7 = a;
            piVar6 = piVar1;
            b = piVar3;
          }
          if ((piVar6 < b) && (b <= piVar7)) goto LAB_0016c6fd;
        }
      }
      operator==();
      goto LAB_0016c70f;
    }
  }
  else {
LAB_0016c70f:
    operator==();
  }
  operator==();
LAB_0016c719:
  operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::AssertHashEqConsistent<google::protobuf::FileDescriptor_const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)a,(FileDescriptor **)b);
  if (a->ctrl_ == (ctrl_t *)0x1) {
    iVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::find_soo<google::protobuf::FileDescriptor_const*>
                      ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)a,(key_arg<const_google::protobuf::FileDescriptor_*> *)b);
    return iVar8.ctrl_._0_1_;
  }
  if (a->ctrl_ == (ctrl_t *)0x0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)a);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)b->ctrl_);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b->ctrl_ +
                 (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8));
  iVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::find_non_soo<google::protobuf::FileDescriptor_const*>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)a,(key_arg<const_google::protobuf::FileDescriptor_*> *)b,
                     SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar8.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }